

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_77::LimitedInputStream::decreaseLimit
          (LimitedInputStream *this,uint64_t amount,uint64_t requested)

{
  uint64_t uVar1;
  Fault f;
  Fault local_10;
  
  uVar1 = this->limit - amount;
  if (this->limit < amount) {
    kj::_::Debug::Fault::Fault
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x48f,FAILED,"limit >= amount","");
    kj::_::Debug::Fault::fatal(&local_10);
  }
  this->limit = uVar1;
  if (uVar1 == 0) {
    Own<kj::AsyncInputStream>::dispose(&this->inner);
    return;
  }
  if (requested <= amount) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x494,FAILED,(char *)0x0,"\"pipe ended prematurely\"",
             (char (*) [23])"pipe ended prematurely");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

void decreaseLimit(uint64_t amount, uint64_t requested) {
    KJ_ASSERT(limit >= amount);
    limit -= amount;
    if (limit == 0) {
      inner = nullptr;
    } else if (amount < requested) {
      KJ_FAIL_REQUIRE("pipe ended prematurely");
    }
  }